

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cc
# Opt level: O3

string * load_string_abi_cxx11_
                   (string *__return_storage_ptr__,bool use_colors,bool use_powerline_left,
                   bool use_powerline_right,short num_averages)

{
  double dVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  ostream *poVar6;
  undefined7 in_register_00000009;
  POWERLINE_DIRECTION direction;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  undefined2 in_register_00000082;
  uint __nelem;
  double *__loadavg;
  ulong uVar7;
  double *pdVar8;
  float fVar9;
  undefined8 uStack_1e0;
  double dStack_1d8;
  long local_1d0;
  ostringstream ss;
  uint auStack_1b8 [22];
  ios_base local_160 [264];
  undefined1 *local_58;
  undefined4 local_4c;
  string *local_48;
  undefined4 local_40;
  POWERLINE_DIRECTION local_3c;
  uint local_38;
  char local_31;
  
  __nelem = CONCAT22(in_register_00000082,num_averages);
  pdVar8 = &dStack_1d8;
  local_3c = (POWERLINE_DIRECTION)CONCAT71(in_register_00000011,use_powerline_left);
  local_40 = (undefined4)CONCAT71(in_register_00000031,use_colors);
  uStack_1e0 = 0x103dea;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
  *(uint *)((long)auStack_1b8 + *(long *)(local_1d0 + -0x18)) =
       *(uint *)((long)auStack_1b8 + *(long *)(local_1d0 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&ss + *(long *)(local_1d0 + -0x18)) = 2;
  lVar2 = -(ulong)((uint)(ushort)num_averages * 8 + 0xf & 0xfffffff0);
  __loadavg = (double *)((long)&dStack_1d8 + lVar2);
  if ((ushort)(num_averages - 4U) < 0xfffd) {
    local_31 = '\0';
    *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103e53;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d0,&local_31,1);
    pdVar8 = &dStack_1d8;
  }
  else {
    *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103e63;
    iVar3 = getloadavg(__loadavg,__nelem);
    if (iVar3 < 0) {
      *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103ff2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d0," 0.00 0.00 0.00",0xf);
    }
    else {
      local_48 = (string *)*__loadavg;
      *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103e7b;
      uVar4 = get_cpu_count();
      uVar5 = (uint)(long)(((double)local_48 / (double)uVar4) * 0.5 * 100.0);
      local_38 = 100;
      if (uVar5 < 100) {
        local_38 = uVar5;
      }
      if ((char)local_40 != '\0') {
        uVar7 = (ulong)local_38;
        direction = POWERLINE_RIGHT;
        if (!use_powerline_right) {
          direction = local_3c & 0xff;
        }
        *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103ee5;
        powerline((ostringstream *)&local_1d0,load_lut[uVar7],direction,false);
      }
      local_31 = ' ';
      *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103efd;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d0,&local_31,1);
      local_4c = (int)CONCAT71(in_register_00000009,use_powerline_right);
      local_58 = (undefined1 *)&dStack_1d8;
      local_48 = __return_storage_ptr__;
      uVar7 = 0;
      do {
        dVar1 = __loadavg[uVar7];
        *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103f3d;
        fVar9 = floorf((float)dVar1 * 100.0 + 0.5);
        if (__nelem - 1 == uVar7) {
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103f56;
          std::ostream::_M_insert<double>((double)(fVar9 / 100.0));
        }
        else {
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103f60;
          poVar6 = std::ostream::_M_insert<double>((double)(fVar9 / 100.0));
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103f74;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        }
        __return_storage_ptr__ = local_48;
        pdVar8 = (double *)local_58;
        uVar7 = uVar7 + 1;
      } while (__nelem != uVar7);
      if ((char)local_40 != '\0') {
        if ((undefined1)local_3c == '\0') {
          if ((char)local_4c == '\0') {
            *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104051;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1d0,"#[fg=default,bg=default]",0x18);
          }
        }
        else {
          uVar7 = (ulong)local_38;
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103fbe;
          powerline((ostringstream *)&local_1d0,load_lut[uVar7],POWERLINE_LEFT,true);
          *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x103fd8;
          powerline((ostringstream *)&local_1d0,"#[fg=default,bg=default]",POWERLINE_LEFT,false);
        }
      }
    }
  }
  *(undefined8 *)((long)&uStack_1e0 + lVar2) = 0x104001;
  std::__cxx11::stringbuf::str();
  *(undefined8 *)((long)pdVar8 + -8) = 0x104017;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
  *(undefined8 *)((long)pdVar8 + -8) = 0x104023;
  std::ios_base::~ios_base(local_160);
  return __return_storage_ptr__;
}

Assistant:

std::string load_string( bool use_colors,
  bool use_powerline_left, bool use_powerline_right,
  short num_averages )
{
  std::ostringstream ss;
  ss.setf( std::ios::fixed, std::ios::floatfield );
  ss.precision( 2 );
  double averages[num_averages];
  // based on: opensource.apple.com/source/Libc/Libc-262/gen/getloadavg.c

  if( num_averages <= 0 || num_averages > 3)
  {
    ss << (char) 0;
    return ss.str();
  }

  if( getloadavg( averages, num_averages ) < 0 )
  {
    ss << " 0.00 0.00 0.00"; // couldn't get averages.
  }
  else
  {
    unsigned load_percent = static_cast<unsigned int>( averages[0] /
        get_cpu_count() * 0.5f * 100.0f );

    if( load_percent > 100 )
    {
      load_percent = 100;
    }
    if( use_colors )
    {
      if( use_powerline_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_RIGHT );
      }
      else if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT );
      }
      else
      {
        powerline( ss, load_lut[load_percent], NONE );
      }
    }

    ss << ' ';
    for( int i = 0; i < num_averages; ++i )
    {
      // Round to nearest, make sure this is only a 0.00 value not a 0.0000
      float avg = floorf( static_cast<float>( averages[i] ) * 100 + 0.5 ) / 100;
      // Don't print trailing whitespace for last element
      if ( i == num_averages-1 )
      {
        ss << avg;
      }
      else
      {
        ss << avg << " ";
      }
    }

    if( use_colors )
    {
      if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline( ss, "#[fg=default,bg=default]", POWERLINE_LEFT );
      }
      else if( !use_powerline_right )
      {
        ss << "#[fg=default,bg=default]";
      }
    }
  }

  return ss.str();
}